

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O1

void __thiscall FString::StripLeft(FString *this,char *charset)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  FStringData *pFVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  
  pcVar1 = this->Chars;
  uVar5 = (ulong)*(uint *)(pcVar1 + -0xc);
  if (uVar5 != 0) {
    uVar6 = 0;
    do {
      pcVar3 = strchr(charset,(int)pcVar1[uVar6]);
      uVar7 = uVar6;
      if (pcVar3 == (char *)0x0) break;
      uVar6 = uVar6 + 1;
      uVar7 = uVar5;
    } while (uVar5 != uVar6);
    if (uVar7 != 0) {
      if (1 < *(int *)(pcVar1 + -4)) {
        sVar8 = uVar5 - uVar7;
        pFVar4 = FStringData::Alloc(sVar8);
        this->Chars = (char *)(pFVar4 + 1);
        pFVar4->Len = (uint)sVar8;
        memcpy(pFVar4 + 1,pcVar1 + uVar7,sVar8);
        *(undefined1 *)((long)pFVar4 + sVar8 + 0xc) = 0;
        FStringData::Release((FStringData *)(pcVar1 + -0xc));
        return;
      }
      sVar8 = 0xffffffffffffffff;
      if (uVar7 <= uVar5) {
        sVar2 = 0;
        do {
          sVar8 = sVar2;
          this->Chars[sVar8] = this->Chars[uVar7 + sVar8];
          sVar2 = sVar8 + 1;
        } while (~uVar5 + uVar7 + sVar8 + 1 != 0);
      }
      ReallocBuffer(this,sVar8);
      return;
    }
  }
  return;
}

Assistant:

FString &FString::operator += (const FString &tail)
{
	size_t len1 = Len();
	size_t len2 = tail.Len();
	ReallocBuffer (len1 + len2);
	StrCopy (Chars + len1, tail);
	return *this;
}